

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang_lex.c
# Opt level: O0

int yylex_init_extra(void *yy_user_defined,yyscan_t *ptr_yy_globals)

{
  long lVar1;
  int *piVar2;
  void *pvVar3;
  undefined1 local_c0 [8];
  yyguts_t dummy_yyguts;
  yyscan_t *ptr_yy_globals_local;
  void *yy_user_defined_local;
  
  dummy_yyguts.yylloc_r = (YYLTYPE *)ptr_yy_globals;
  yyset_extra(yy_user_defined,local_c0);
  if (dummy_yyguts.yylloc_r == (YYLTYPE *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    yy_user_defined_local._4_4_ = 1;
  }
  else {
    pvVar3 = yyalloc(0xa0,local_c0);
    *(void **)dummy_yyguts.yylloc_r = pvVar3;
    lVar1._0_4_ = (dummy_yyguts.yylloc_r)->first_line;
    lVar1._4_4_ = (dummy_yyguts.yylloc_r)->first_column;
    if (lVar1 == 0) {
      piVar2 = __errno_location();
      *piVar2 = 0xc;
      yy_user_defined_local._4_4_ = 1;
    }
    else {
      memset(*(void **)dummy_yyguts.yylloc_r,0,0xa0);
      yyset_extra(yy_user_defined,*(yyscan_t *)dummy_yyguts.yylloc_r);
      yy_user_defined_local._4_4_ = yy_init_globals(*(yyscan_t *)dummy_yyguts.yylloc_r);
    }
  }
  return yy_user_defined_local._4_4_;
}

Assistant:

int yylex_init_extra(YY_EXTRA_TYPE yy_user_defined,yyscan_t* ptr_yy_globals )
{
    struct yyguts_t dummy_yyguts;

    yyset_extra (yy_user_defined, &dummy_yyguts);

    if (ptr_yy_globals == NULL){
        errno = EINVAL;
        return 1;
    }
	
    *ptr_yy_globals = (yyscan_t) yyalloc ( sizeof( struct yyguts_t ), &dummy_yyguts );
	
    if (*ptr_yy_globals == NULL){
        errno = ENOMEM;
        return 1;
    }
    
    /* By setting to 0xAA, we expose bugs in
    yy_init_globals. Leave at 0x00 for releases. */
    memset(*ptr_yy_globals,0x00,sizeof(struct yyguts_t));
    
    yyset_extra (yy_user_defined, *ptr_yy_globals);
    
    return yy_init_globals ( *ptr_yy_globals );
}